

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indent.cc
# Opt level: O0

void __thiscall libwebm::Indent::Indent(Indent *this,int indent)

{
  int indent_local;
  Indent *this_local;
  
  this->indent_ = indent;
  std::__cxx11::string::string((string *)&this->indent_str_);
  Update(this);
  return;
}

Assistant:

Indent::Indent(int indent) : indent_(indent), indent_str_() { Update(); }